

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::replace_illegal_names(CompilerHLSL *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  string *local_180;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_105;
  key_equal local_104;
  hasher local_103;
  undefined1 local_102;
  allocator local_101;
  allocator local_100;
  allocator local_ff;
  allocator local_fe;
  allocator local_fd [20];
  allocator local_e9;
  string *local_e8;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  CompilerHLSL *local_10;
  CompilerHLSL *this_local;
  
  local_10 = this;
  if (replace_illegal_names()::keywords_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&replace_illegal_names()::keywords_abi_cxx11_);
    if (iVar1 != 0) {
      local_102 = 1;
      local_e8 = local_e0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_e0,"line",&local_e9);
      local_e8 = local_c0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_c0,"linear",local_fd);
      local_e8 = local_a0;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0,"matrix",&local_fe);
      local_e8 = local_80;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_80,"point",&local_ff);
      local_e8 = local_60;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_60,"row_major",&local_100);
      local_e8 = local_40;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_40,"sampler",&local_101);
      local_102 = 0;
      local_20 = (iterator)local_e0;
      local_18 = 6;
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_105);
      __l._M_len = local_18;
      __l._M_array = local_20;
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::unordered_set(&replace_illegal_names()::keywords_abi_cxx11_,__l,0,&local_103,&local_104,
                      &local_105);
      ::std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_105);
      local_180 = (string *)&local_20;
      do {
        local_180 = local_180 + -0x20;
        ::std::__cxx11::string::~string(local_180);
      } while (local_180 != local_e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ff);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fe);
      ::std::allocator<char>::~allocator((allocator<char> *)local_fd);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,&replace_illegal_names()::keywords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&replace_illegal_names()::keywords_abi_cxx11_);
    }
  }
  CompilerGLSL::replace_illegal_names
            (&this->super_CompilerGLSL,&replace_illegal_names()::keywords_abi_cxx11_);
  CompilerGLSL::replace_illegal_names(&this->super_CompilerGLSL);
  return;
}

Assistant:

void CompilerHLSL::replace_illegal_names()
{
	static const unordered_set<string> keywords = {
		// Additional HLSL specific keywords.
		"line", "linear", "matrix", "point", "row_major", "sampler",
	};

	CompilerGLSL::replace_illegal_names(keywords);
	CompilerGLSL::replace_illegal_names();
}